

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_is_prime(mbedtls_mpi *X,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int iVar2;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi XX;
  mbedtls_mpi Y;
  mbedtls_mpi_uint local_58;
  mbedtls_mpi local_50;
  mbedtls_mpi local_38;
  
  local_38.p = &local_58;
  local_50.s = 1;
  local_50.n = X->n;
  local_50.p = X->p;
  local_58 = 0;
  local_38.s = 1;
  local_38.n = 1;
  iVar1 = mbedtls_mpi_cmp_mpi(&local_50,&local_38);
  iVar2 = -0xe;
  if (iVar1 != 0) {
    local_58 = 1;
    local_38.s = 1;
    local_38.n = 1;
    local_38.p = &local_58;
    iVar1 = mbedtls_mpi_cmp_mpi(&local_50,&local_38);
    if (iVar1 != 0) {
      local_58 = 2;
      local_38.s = 1;
      local_38.n = 1;
      local_38.p = &local_58;
      iVar1 = mbedtls_mpi_cmp_mpi(&local_50,&local_38);
      iVar2 = 0;
      if (iVar1 != 0) {
        iVar2 = mpi_check_small_factors(&local_50);
        if (iVar2 == 0) {
          iVar2 = mpi_miller_rabin(&local_50,f_rng,p_rng);
        }
        else if (iVar2 == 1) {
          return 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_is_prime( const mbedtls_mpi *X,
                  int (*f_rng)(void *, unsigned char *, size_t),
                  void *p_rng )
{
    int ret;
    mbedtls_mpi XX;

    XX.s = 1;
    XX.n = X->n;
    XX.p = X->p;

    if( mbedtls_mpi_cmp_int( &XX, 0 ) == 0 ||
        mbedtls_mpi_cmp_int( &XX, 1 ) == 0 )
        return( MBEDTLS_ERR_MPI_NOT_ACCEPTABLE );

    if( mbedtls_mpi_cmp_int( &XX, 2 ) == 0 )
        return( 0 );

    if( ( ret = mpi_check_small_factors( &XX ) ) != 0 )
    {
        if( ret == 1 )
            return( 0 );

        return( ret );
    }

    return( mpi_miller_rabin( &XX, f_rng, p_rng ) );
}